

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O2

void __thiscall Type1Input::~Type1Input(Type1Input *this)

{
  (this->super_Type1InterpreterImplementationAdapter).super_IType1InterpreterImplementation.
  _vptr_IType1InterpreterImplementation = (_func_int **)&PTR_Type1Hstem_00370a60;
  FreeTables(this);
  InputPFBDecodeStream::~InputPFBDecodeStream(&this->mPFBDecoder);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
  ::~_Rb_tree(&(this->mCharStrings)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::~_Rb_tree(&(this->mReverseEncoding)._M_t);
  Type1Encoding::~Type1Encoding(&this->mEncoding);
  Type1PrivateDictionary::~Type1PrivateDictionary(&this->mPrivateDictionary);
  Type1FontInfoDictionary::~Type1FontInfoDictionary(&this->mFontInfoDictionary);
  std::__cxx11::string::~string((string *)&this->mFontDictionary);
  return;
}

Assistant:

Type1Input::~Type1Input(void)
{
	FreeTables();
}